

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

int pipScaleFromStr(string *value)

{
  bool bVar1;
  int iVar2;
  string v;
  string local_28;
  
  strToLowerCase(&local_28,value);
  trimStr(&v,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  bVar1 = std::operator==(&v,"1/2");
  iVar2 = 2;
  if (!bVar1) {
    bVar1 = std::operator==(&v,"0.5");
    if (!bVar1) {
      bVar1 = std::operator==(&v,"1/4");
      iVar2 = 3;
      if (!bVar1) {
        bVar1 = std::operator==(&v,"0.25");
        if (!bVar1) {
          bVar1 = std::operator==(&v,"1.5");
          if (bVar1) {
            iVar2 = 4;
          }
          else {
            bVar1 = std::operator==(&v,"fullscreen");
            iVar2 = (uint)bVar1 * 4 + 1;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&v);
  return iVar2;
}

Assistant:

int pipScaleFromStr(const std::string& value)
{
    const std::string v = trimStr(strToLowerCase(value));

    if (v == "1/2" || v == "0.5")
        return 2;
    if (v == "1/4" || v == "0.25")
        return 3;
    if (v == "1.5")
        return 4;
    if (v == "fullscreen")
        return 5;

    return 1;  // default
}